

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O0

spv_result_t spvtools::val::ModuleLayoutPass(ValidationState_t *_,Instruction *inst)

{
  Op opcode_00;
  ModuleLayoutSection MVar1;
  spv_result_t sVar2;
  spv_result_t error_1;
  spv_result_t error;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  opcode_00 = Instruction::opcode(inst);
  MVar1 = ValidationState_t::current_layout_section(_);
  if (MVar1 < kLayoutFunctionDeclarations) {
    sVar2 = anon_unknown_4::ModuleScopedInstructions(_,inst,opcode_00);
  }
  else {
    if (1 < MVar1 - kLayoutFunctionDeclarations) {
      return SPV_SUCCESS;
    }
    sVar2 = anon_unknown_4::FunctionScopedInstructions(_,inst,opcode_00);
  }
  if (sVar2 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t ModuleLayoutPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (_.current_layout_section()) {
    case kLayoutCapabilities:
    case kLayoutExtensions:
    case kLayoutExtInstImport:
    case kLayoutMemoryModel:
    case kLayoutSamplerImageAddressMode:
    case kLayoutEntryPoint:
    case kLayoutExecutionMode:
    case kLayoutDebug1:
    case kLayoutDebug2:
    case kLayoutDebug3:
    case kLayoutAnnotations:
    case kLayoutTypes:
      if (auto error = ModuleScopedInstructions(_, inst, opcode)) return error;
      break;
    case kLayoutFunctionDeclarations:
    case kLayoutFunctionDefinitions:
      if (auto error = FunctionScopedInstructions(_, inst, opcode)) {
        return error;
      }
      break;
  }
  return SPV_SUCCESS;
}